

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O2

void __thiscall n_pca::NPca::saveData(NPca *this)

{
  pointer piVar1;
  char cVar2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  int i_1;
  long lVar5;
  ofstream file;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> local_68 [56];
  
  puts("start save...");
  if ((this->n_config_->save_data_path_)._M_string_length != 0) {
    std::ofstream::ofstream(&file,(this->n_config_->save_data_path_)._M_dataplus._M_p,_S_out);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      puts("open file failed!");
    }
    else {
      std::ios::clear((int)&file + (int)*(undefined8 *)(_file + -0x18));
      poVar3 = std::operator<<((ostream *)&file,"dimension: ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->n_config_->dimension_);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,"image_width: ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->n_config_->image_width_);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,"image_height: ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->n_config_->image_height_)
      ;
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,"train_mean: ");
      poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                        &this->train_mean_);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::operator<<((ostream *)&file,"train_label: ");
      for (uVar4 = 0;
          piVar1 = (this->train_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar4 < (ulong)((long)(this->train_label_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
          uVar4 = uVar4 + 1) {
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&file,piVar1[uVar4]);
        std::operator<<(poVar3," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&file);
      std::operator<<((ostream *)&file,"train_data_matrix: ");
      for (lVar5 = 0;
          lVar5 < (this->train_data_matrix_).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
          lVar5 = lVar5 + 1) {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_68,
                   &this->train_data_matrix_,lVar5);
        poVar3 = Eigen::operator<<((ostream *)&file,local_68);
        std::operator<<(poVar3,",");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&file);
      std::operator<<((ostream *)&file,"basic_matrix:");
      for (lVar5 = 0;
          lVar5 < (this->basic_matrix_).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
          lVar5 = lVar5 + 1) {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_68,
                   &this->basic_matrix_,lVar5);
        poVar3 = Eigen::operator<<((ostream *)&file,local_68);
        std::operator<<(poVar3,",");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&file);
      std::ofstream::close();
      printf("save data to %s\n",(this->n_config_->save_data_path_)._M_dataplus._M_p);
    }
    std::ofstream::~ofstream(&file);
    return;
  }
  puts("couldn\'t find save path!");
  return;
}

Assistant:

void NPca::saveData()
{
    printf("start save...\n");
    if (n_config_->save_data_path_.size() < 1)
    {
        printf("couldn't find save path!\n");
        return;
    }

    ofstream file(n_config_->save_data_path_.c_str());
    
    if (!file.is_open())
    {
        printf("open file failed!\n");
        return;
    }

    file.clear();
    file<<"dimension: "<<n_config_->dimension_<<endl;
    file<<"image_width: "<<n_config_->image_width_<<endl;
    file<<"image_height: "<<n_config_->image_height_<<endl;
    file<<"train_mean: "<<train_mean_<<endl;

    file<<"train_label: ";
    for (int i = 0; i < train_label_.size(); i++)
        file<<train_label_[i]<<" ";
    file<<endl;
    
    file<<"train_data_matrix: ";
    for (int i = 0; i < train_data_matrix_.rows(); i++)
        file<<train_data_matrix_.row(i)<<",";
    file<<endl;

    file<<"basic_matrix:";
    for (int i = 0; i < basic_matrix_.rows(); i++)
        file<<basic_matrix_.row(i)<<",";
    file<<endl;

    file.close();

    printf("save data to %s\n", n_config_->save_data_path_.c_str());
}